

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O2

int __thiscall
flow_cutter::
SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
::init(SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
       *this,EVP_PKEY_CTX *ctx)

{
  GraphSearchAlgorithm GVar1;
  Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
  *pGVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Config config;
  Config config_00;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  runtime_error *this_00;
  Config *extraout_RAX;
  Config *extraout_RAX_00;
  Config *pCVar19;
  int in_EDX;
  DistanceType dist_type;
  BreadthFirstSearch local_69;
  EVP_PKEY_CTX *local_68;
  PierceNodeScore local_5c;
  
  pCVar19 = &this->config;
  GVar1 = (this->config).graph_search_algorithm;
  dist_type = (DistanceType)((this->config).pierce_rating < random);
  local_68 = ctx;
  if (GVar1 == pseudo_depth_first_search) {
    pGVar2 = this->graph;
    uVar4 = (this->config).avoid_augmenting_path;
    uVar12 = pCVar19->cutter_count;
    uVar13 = pCVar19->random_seed;
    uVar14 = pCVar19->max_cut_size;
    uVar15 = pCVar19->min_small_side_size;
    uVar16 = pCVar19->skip_non_maximum_sides;
    uVar17 = pCVar19->separator_selection;
    uVar18 = pCVar19->graph_search_algorithm;
    config_00.graph_search_algorithm = uVar18;
    config_00.separator_selection = uVar17;
    config_00.skip_non_maximum_sides = uVar16;
    config_00.min_small_side_size = (float)uVar15;
    config_00.max_cut_size = uVar14;
    config_00.random_seed = uVar13;
    config_00.cutter_count = uVar12;
    config_00.avoid_augmenting_path = uVar4;
    config_00.pierce_rating = (this->config).pierce_rating;
    PierceNodeScore::PierceNodeScore(&local_5c,config_00);
    MultiCutter::
    init<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::PseudoDepthFirstSearch,flow_cutter::PierceNodeScore>
              (&this->cutter,pGVar2,&this->tmp,(PseudoDepthFirstSearch *)&local_69,&local_5c,
               dist_type,
               (vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
                *)local_68,(this->config).max_cut_size,in_EDX,
               (this->config).skip_non_maximum_sides == skip);
    pCVar19 = extraout_RAX_00;
  }
  else if (GVar1 == breadth_first_search) {
    pGVar2 = this->graph;
    uVar3 = (this->config).avoid_augmenting_path;
    uVar5 = pCVar19->cutter_count;
    uVar6 = pCVar19->random_seed;
    uVar7 = pCVar19->max_cut_size;
    uVar8 = pCVar19->min_small_side_size;
    uVar9 = pCVar19->skip_non_maximum_sides;
    uVar10 = pCVar19->separator_selection;
    uVar11 = pCVar19->graph_search_algorithm;
    config.graph_search_algorithm = uVar11;
    config.separator_selection = uVar10;
    config.skip_non_maximum_sides = uVar9;
    config.min_small_side_size = (float)uVar8;
    config.max_cut_size = uVar7;
    config.random_seed = uVar6;
    config.cutter_count = uVar5;
    config.avoid_augmenting_path = uVar3;
    config.pierce_rating = (this->config).pierce_rating;
    PierceNodeScore::PierceNodeScore(&local_5c,config);
    MultiCutter::
    init<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::BreadthFirstSearch,flow_cutter::PierceNodeScore>
              (&this->cutter,pGVar2,&this->tmp,&local_69,&local_5c,dist_type,
               (vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
                *)local_68,(this->config).max_cut_size,in_EDX,
               (this->config).skip_non_maximum_sides == skip);
    pCVar19 = extraout_RAX;
  }
  else if (GVar1 == depth_first_search) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"depth first search is not yet implemented");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return (int)pCVar19;
}

Assistant:

void init(const std::vector<SourceTargetPair>& p, int random_seed)
    {
        DistanceType dist_type;

        if (config.pierce_rating == Config::PierceRating::min_source_hop_dist || config.pierce_rating == Config::PierceRating::max_target_hop_dist || config.pierce_rating == Config::PierceRating::max_target_minus_source_hop_dist)
            dist_type = DistanceType::hop_distance;
        else
            dist_type = DistanceType::no_distance;

        switch (config.graph_search_algorithm) {
        case Config::GraphSearchAlgorithm::pseudo_depth_first_search:
            cutter.init(graph, tmp, PseudoDepthFirstSearch(), PierceNodeScore(config),
                dist_type, p, config.max_cut_size, random_seed,
                config.skip_non_maximum_sides == Config::SkipNonMaximumSides::skip);
            break;

        case Config::GraphSearchAlgorithm::breadth_first_search:
            cutter.init(graph, tmp, BreadthFirstSearch(), PierceNodeScore(config),
                dist_type, p, config.max_cut_size, random_seed,
                config.skip_non_maximum_sides == Config::SkipNonMaximumSides::skip);
            break;

        case Config::GraphSearchAlgorithm::depth_first_search:
            throw std::runtime_error("depth first search is not yet implemented");
        default:
            assert(false);
        }
    }